

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

string_base<allocator_default<char>_> * __thiscall
string_base<allocator_default<char>_>::operator=
          (string_base<allocator_default<char>_> *this,char *other)

{
  uint uVar1;
  EVP_PKEY_CTX *in_RSI;
  string_base<allocator_default<char>_> *in_RDI;
  
  free(in_RDI,in_RSI);
  if (in_RSI != (EVP_PKEY_CTX *)0x0) {
    uVar1 = str_length((char *)0x1d647d);
    copy(in_RDI,in_RSI,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  return in_RDI;
}

Assistant:

string_base &operator = (const char *other)
	{
		free();
		if(other)
			copy(other, str_length(other));
		return *this;
	}